

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

void __thiscall cmSourceFileLocation::UpdateExtension(cmSourceFileLocation *this,string *name)

{
  string_view ext_00;
  cmake *this_00;
  cmMakefile *this_01;
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *ext_01;
  string *a;
  bool local_159;
  string local_138;
  char local_111;
  string local_110;
  undefined1 local_f0 [8];
  string tryPath;
  string local_a0;
  cmake *local_80;
  cmake *cm;
  cmMakefile *mf;
  cmGlobalGenerator *gg;
  string local_58 [32];
  undefined1 local_38 [8];
  string ext;
  string *name_local;
  cmSourceFileLocation *this_local;
  
  ext.field_2._8_8_ = name;
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0x5b,"void cmSourceFileLocation::UpdateExtension(const std::string &)");
  }
  cmsys::SystemTools::GetFilenameLastExtension((string *)local_38,name);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)local_38);
    std::__cxx11::string::operator=((string *)local_38,local_58);
    std::__cxx11::string::~string(local_58);
  }
  mf = (cmMakefile *)cmMakefile::GetGlobalGenerator(this->Makefile);
  cm = (cmake *)this->Makefile;
  local_80 = cmMakefile::GetCMakeInstance((cmMakefile *)cm);
  this_01 = mf;
  ext_01 = (char *)std::__cxx11::string::c_str();
  cmGlobalGenerator::GetLanguageFromExtension_abi_cxx11_
            (&local_a0,(cmGlobalGenerator *)this_01,ext_01);
  bVar1 = std::__cxx11::string::empty();
  this_00 = local_80;
  local_159 = true;
  if ((bVar1 & 1) != 0) {
    ext_00 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    local_159 = cmake::IsAKnownExtension(this_00,ext_00);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  if (local_159 == false) {
    std::__cxx11::string::string((string *)local_f0);
    if ((this->AmbiguousDirectory & 1U) != 0) {
      a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      local_111 = '/';
      cmStrCat<std::__cxx11::string_const&,char>(&local_110,a,&local_111);
      std::__cxx11::string::operator=((string *)local_f0,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_f0,(string *)&this->Directory);
      std::__cxx11::string::operator+=((string *)local_f0,"/");
    }
    std::__cxx11::string::operator+=((string *)local_f0,(string *)&this->Name);
    bVar2 = cmsys::SystemTools::FileExists((string *)local_f0,true);
    if (bVar2) {
      cmsys::SystemTools::GetFilenameName(&local_138,(string *)ext.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      this->AmbiguousExtension = false;
      if ((this->AmbiguousDirectory & 1U) != 0) {
        DirectoryUseSource(this);
      }
    }
    std::__cxx11::string::~string((string *)local_f0);
  }
  else {
    cmsys::SystemTools::GetFilenameName
              ((string *)((long)&tryPath.field_2 + 8),(string *)ext.field_2._8_8_);
    std::__cxx11::string::operator=
              ((string *)&this->Name,(string *)(tryPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(tryPath.field_2._M_local_buf + 8));
    this->AmbiguousExtension = false;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmSourceFileLocation::UpdateExtension(const std::string& name)
{
  assert(this->Makefile);
  // Check the extension.
  std::string ext = cmSystemTools::GetFilenameLastExtension(name);
  if (!ext.empty()) {
    ext = ext.substr(1);
  }

  // The global generator checks extensions of enabled languages.
  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
  cmMakefile const* mf = this->Makefile;
  auto* cm = mf->GetCMakeInstance();
  if (!gg->GetLanguageFromExtension(ext.c_str()).empty() ||
      cm->IsAKnownExtension(ext)) {
    // This is a known extension.  Use the given filename with extension.
    this->Name = cmSystemTools::GetFilenameName(name);
    this->AmbiguousExtension = false;
  } else {
    // This is not a known extension.  See if the file exists on disk as
    // named.
    std::string tryPath;
    if (this->AmbiguousDirectory) {
      // Check the source tree only because a file in the build tree should
      // be specified by full path at least once.  We do not want this
      // detection to depend on whether the project has already been built.
      tryPath = cmStrCat(this->Makefile->GetCurrentSourceDirectory(), '/');
    }
    if (!this->Directory.empty()) {
      tryPath += this->Directory;
      tryPath += "/";
    }
    tryPath += this->Name;
    if (cmSystemTools::FileExists(tryPath, true)) {
      // We found a source file named by the user on disk.  Trust it's
      // extension.
      this->Name = cmSystemTools::GetFilenameName(name);
      this->AmbiguousExtension = false;

      // If the directory was ambiguous, it isn't anymore.
      if (this->AmbiguousDirectory) {
        this->DirectoryUseSource();
      }
    }
  }
}